

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O3

bool __thiscall
iDynTree::SubModelDecomposition::splitModelAlongJoints
          (SubModelDecomposition *this,Model *model,Traversal *fullModelTraversal,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *splitJoints)

{
  pointer pbVar1;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer puVar3;
  unsigned_long uVar4;
  int iVar5;
  uint uVar6;
  JointIndex JVar7;
  size_t __new_size;
  Link *this_00;
  LinkIndex LVar8;
  IJoint *pIVar9;
  undefined4 extraout_var;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  Link *this_01;
  LinkIndex LVar11;
  ostream *poVar12;
  long lVar13;
  ulong uVar14;
  pointer pbVar15;
  char *pcVar16;
  ulong uVar17;
  size_type *psVar18;
  unsigned_long uVar19;
  ulong uVar20;
  string jointToParentName;
  string local_50;
  
  pbVar15 = (splitJoints->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((splitJoints->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar15) {
    uVar17 = 0;
    do {
      JVar7 = Model::getJointIndex(model,pbVar15 + uVar17);
      if (JVar7 == JOINT_INVALID_INDEX) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "[ERROR] SubModelDecomposition::splitModelAlongJoints error : ",0x3d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," requested to split the model along joint ",0x2a);
        pbVar15 = (splitJoints->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pbVar15[uVar17]._M_dataplus._M_p,
                             pbVar15[uVar17]._M_string_length);
        pcVar16 = " but no joint with that is in the model. ";
        lVar13 = 0x29;
LAB_0016498c:
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar16,lVar13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        return false;
      }
      pbVar15 = (splitJoints->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (splitJoints->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      uVar20 = (long)pbVar1 - (long)pbVar15 >> 5;
      if (pbVar1 != pbVar15) {
        psVar18 = &pbVar15->_M_string_length;
        uVar14 = 0;
        do {
          if (((uVar17 != uVar14) && (__n = pbVar15[uVar17]._M_string_length, __n == *psVar18)) &&
             ((__n == 0 ||
              (iVar5 = bcmp(pbVar15[uVar17]._M_dataplus._M_p,
                            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (psVar18 + -1))->_M_dataplus)._M_p,__n), iVar5 == 0)))) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "[ERROR] SubModelDecomposition::splitModelAlongJoints error : ",0x3d);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr," the joint ",0xb);
            pbVar15 = (splitJoints->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,pbVar15[uVar17]._M_dataplus._M_p,
                                 pbVar15[uVar17]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," is both the element ",0x15)
            ;
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," and ",5);
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12," of the splitJoints list,",0x19);
            pcVar16 = " please check the list of joints.";
            lVar13 = 0x21;
            goto LAB_0016498c;
          }
          uVar14 = uVar14 + 1;
          psVar18 = psVar18 + 4;
        } while (uVar20 + (uVar20 == 0) != uVar14);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < uVar20);
  }
  __new_size = Model::getNrOfLinks(model);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->link2subModelIndex,__new_size);
  setNrOfSubModels(this,((long)(splitJoints->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(splitJoints->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  uVar6 = Traversal::getNrOfVisitedLinks(fullModelTraversal);
  if (uVar6 != 0) {
    uVar19 = 0;
    uVar17 = 0;
    do {
      this_00 = Traversal::getLink(fullModelTraversal,uVar17);
      LVar8 = Link::getIndex(this_00);
      if (uVar17 == 0) {
LAB_0016482d:
        (this->link2subModelIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_start[LVar8] = uVar19;
        Traversal::reset((this->subModelTraversals).
                         super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar19],model);
        Traversal::addTraversalBase
                  ((this->subModelTraversals).
                   super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar19],this_00);
        uVar19 = uVar19 + 1;
      }
      else {
        pIVar9 = Traversal::getParentJoint(fullModelTraversal,uVar17);
        iVar5 = (*pIVar9->_vptr_IJoint[0x14])(pIVar9);
        Model::getJointName_abi_cxx11_(&local_50,model,CONCAT44(extraout_var,iVar5));
        _Var10 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           ((splitJoints->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                            (splitJoints->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish,&local_50);
        pbVar2 = (splitJoints->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (_Var10._M_current != pbVar2) goto LAB_0016482d;
        this_01 = Traversal::getParentLink(fullModelTraversal,uVar17);
        pIVar9 = Traversal::getParentJoint(fullModelTraversal,uVar17);
        LVar11 = Link::getIndex(this_01);
        puVar3 = (this->link2subModelIndex).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = puVar3[LVar11];
        puVar3[LVar8] = uVar4;
        Traversal::addTraversalElement
                  ((this->subModelTraversals).
                   super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar4],this_00,pIVar9,this_01);
      }
      uVar17 = uVar17 + 1;
      uVar6 = Traversal::getNrOfVisitedLinks(fullModelTraversal);
    } while (uVar17 < uVar6);
  }
  return true;
}

Assistant:

bool SubModelDecomposition::splitModelAlongJoints(const Model& model,
                                                  const Traversal& fullModelTraversal,
                                                  const std::vector< std::string >& splitJoints)
{
    // first we check that all the splitJoints are actually
    // joints of the model
    for(size_t jnt=0; jnt < splitJoints.size(); jnt++ )
    {
        if( model.getJointIndex(splitJoints[jnt]) == JOINT_INVALID_INDEX )
        {
            std::cerr << "[ERROR] SubModelDecomposition::splitModelAlongJoints error : "
                      << " requested to split the model along joint " << splitJoints[jnt]
                      << " but no joint with that is in the model. " << std::endl;
            return false;
        }

        // Check for duplicates (while it would be possible to handle duplicates,
        // duplicates are tipically associated with some error in the input parameters)
        // O(n^2) solution for checking the duplicates, it can be improved but this simple solution
        // should work fine for tipical uses cases
        for (size_t duplicateJnt=0; duplicateJnt < splitJoints.size(); duplicateJnt++ )
        {
            if (duplicateJnt != jnt && splitJoints[jnt] == splitJoints[duplicateJnt])
            {
                std::cerr << "[ERROR] SubModelDecomposition::splitModelAlongJoints error : "
                          << " the joint " << splitJoints[jnt] << " is both the element "
                          << jnt << " and " << duplicateJnt << " of the splitJoints list,"
                          << " please check the list of joints." << std::endl;
                return false;
            }
        }
    }

    // secondly we check for duplicates

    // The number of link in the decomposition is exactly
    // the number of links in the model
    this->link2subModelIndex.resize(model.getNrOfLinks());

    // we first need to resize the decomposition
    // the number of the submodels is exactly the number of the joints
    // aloing we are dividing the model, plus one
    this->setNrOfSubModels(splitJoints.size()+1);

    // we will assign links to the submodel using a
    // simple scheme: the base of the full tree traversal
    // is assinged to submodel 0. Then we visit the links
    // of the traversal, and we assign a link to the submodel
    // of its parent, unless it is connected to its parent
    // with a joint contained in splitJoints : in that case
    // the link is assigned to a new submodel, and it became
    // the base of the traversal of that submodel .
    size_t newSubModelIndexAvailableToUse = 0;

    for(size_t fullModelTraversalEl=0;
        fullModelTraversalEl < fullModelTraversal.getNrOfVisitedLinks();
        fullModelTraversalEl++)
    {
        LinkConstPtr visitedLink = fullModelTraversal.getLink(fullModelTraversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();

        // the link is assigned to a new subModel if
        // the visited link is the base or if it is connected
        // to its parent with a split joint
        bool isLinkBaseOfNewSubModel = false;
        bool isLinkBaseOfFullTreeTraversal = (fullModelTraversalEl == 0);

        if( isLinkBaseOfFullTreeTraversal )
        {
            isLinkBaseOfNewSubModel = true;
        }
        else
        {
            IJointConstPtr jointToParent = fullModelTraversal.getParentJoint(fullModelTraversalEl);
            std::string jointToParentName = model.getJointName(jointToParent->getIndex());

            bool isJointToParentASplitJoint =
                (std::find(splitJoints.begin(), splitJoints.end(), jointToParentName) != splitJoints.end());

            if( isJointToParentASplitJoint )
            {
                isLinkBaseOfNewSubModel = true;
            }

        }

        if( isLinkBaseOfNewSubModel )
        {
            this->link2subModelIndex[visitedLinkIndex] = newSubModelIndexAvailableToUse;
            this->subModelTraversals[newSubModelIndexAvailableToUse]->reset(model);
            this->subModelTraversals[newSubModelIndexAvailableToUse]->addTraversalBase(visitedLink);

            newSubModelIndexAvailableToUse++;
        }
        else
        {
            // In this case we know that the link has a parent,
            // otherwise it would be a base of the submodel traversal
            LinkConstPtr parentLink = fullModelTraversal.getParentLink(fullModelTraversalEl);
            IJointConstPtr jointToParent = fullModelTraversal.getParentJoint(fullModelTraversalEl);

            size_t subModelIndex = this->link2subModelIndex[visitedLinkIndex]
                                 = this->link2subModelIndex[parentLink->getIndex()];

            this->subModelTraversals[subModelIndex]->addTraversalElement(visitedLink,jointToParent,parentLink);
        }
    }

    return true;
}